

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsPrivateHasProperty(JsValueRef object,JsValueRef key,bool *hasProperty)

{
  anon_class_24_3_e8175704 fn;
  JsErrorCode JVar1;
  bool **in_stack_ffffffffffffffc0;
  bool *local_20;
  bool *hasProperty_local;
  JsValueRef key_local;
  JsValueRef object_local;
  
  fn.key = &local_20;
  fn.object = &hasProperty_local;
  fn.hasProperty = in_stack_ffffffffffffffc0;
  local_20 = hasProperty;
  hasProperty_local = (bool *)key;
  key_local = object;
  JVar1 = ContextAPIWrapper<false,JsPrivateHasProperty::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsPrivateHasProperty(
    _In_ JsValueRef object,
    _In_ JsValueRef key,
    _Out_ bool *hasProperty)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_REFERENCE(key, scriptContext);
        PARAM_NOT_NULL(hasProperty);
        *hasProperty = false;

        Js::DynamicObject* dynObj = Js::VarTo<Js::DynamicObject>(object);
        if (!dynObj->HasObjectArray())
        {
            return JsNoError;
        }
        *hasProperty = Js::JavascriptOperators::OP_HasItem(dynObj->GetObjectArray(), key, scriptContext) != 0;

        return JsNoError;
    });
}